

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void assume_value_suite::get_const_boolean(void)

{
  bool *pbVar1;
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_38,true);
  pbVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::assume_value<bool>
                     ((basic_variable<std::allocator<char>_> *)local_38);
  boost::detail::test_impl
            ("data.assume_value<bool>() == true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x131f,"void assume_value_suite::get_const_boolean()",(bool)(*pbVar1 & 1));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void get_const_boolean()
{
    const variable data(true);
    TRIAL_PROTOCOL_TEST(data.assume_value<bool>() == true);
}